

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::SetStaticResourcesInitialized
          (ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *this)

{
  char (*in_RCX) [31];
  string msg;
  string local_30;
  
  if (this->m_bStaticResourcesInitialized == true) {
    FormatString<char[26],char[31]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!m_bStaticResourcesInitialized",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"SetStaticResourcesInitialized",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
               ,0xaf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_bStaticResourcesInitialized = true;
  return;
}

Assistant:

void SetStaticResourcesInitialized()
    {
        VERIFY_EXPR(!m_bStaticResourcesInitialized);
        m_bStaticResourcesInitialized = true;
    }